

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_mixer.c
# Opt level: O3

_Bool al_set_mixer_frequency(ALLEGRO_MIXER *mixer,uint val)

{
  ALLEGRO_MIXER *pAVar1;
  
  pAVar1 = (mixer->ss).parent.u.mixer;
  if (pAVar1 == (ALLEGRO_MIXER *)0x0) {
    (mixer->ss).spl_data.frequency = val;
  }
  else {
    _al_set_error(2,"Attempted to change the frequency of an attached mixer");
  }
  return pAVar1 == (ALLEGRO_MIXER *)0x0;
}

Assistant:

bool al_set_mixer_frequency(ALLEGRO_MIXER *mixer, unsigned int val)
{
   ASSERT(mixer);

   /* You can change the frequency of a mixer as long as it's not attached
    * to anything.
    */
   if (mixer->ss.parent.u.ptr) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
            "Attempted to change the frequency of an attached mixer");
      return false;
   }

   mixer->ss.spl_data.frequency = val;
   return true;
}